

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2RenderUtil.cpp
# Opt level: O0

void deqp::egl::gles2::clear(Functions *gl,int x,int y,int width,int height,Vec4 *color)

{
  glClearColorFunc p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 *color_local;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  Functions *gl_local;
  
  (*gl->enable)(0xc11);
  (*gl->scissor)(x,y,width,height);
  p_Var1 = gl->clearColor;
  fVar2 = tcu::Vector<float,_4>::x(color);
  fVar3 = tcu::Vector<float,_4>::y(color);
  fVar4 = tcu::Vector<float,_4>::z(color);
  fVar5 = tcu::Vector<float,_4>::w(color);
  (*p_Var1)(fVar2,fVar3,fVar4,fVar5);
  (*gl->clear)(0x4000);
  (*gl->disable)(0xc11);
  return;
}

Assistant:

void clear (const glw::Functions& gl, int x, int y, int width, int height, const tcu::Vec4& color)
{
	gl.enable(GL_SCISSOR_TEST);
	gl.scissor(x, y, width, height);
	gl.clearColor(color.x(), color.y(), color.z(), color.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.disable(GL_SCISSOR_TEST);
}